

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

int32_t icu_63::number::impl::SimpleModifier::formatTwoArgPattern
                  (SimpleFormatter *compiled,NumberStringBuilder *result,int32_t index,
                  int32_t *outPrefixLength,int32_t *outSuffixLength,Field field,UErrorCode *status)

{
  char16_t cVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString *this;
  char16_t *compiledPattern_00;
  int local_60;
  int32_t suffixLength;
  int32_t infixLength;
  int32_t prefixLength;
  int32_t length;
  int32_t offset;
  int32_t argLimit;
  UnicodeString *compiledPattern;
  Field field_local;
  int32_t *outSuffixLength_local;
  int32_t *outPrefixLength_local;
  int32_t index_local;
  NumberStringBuilder *result_local;
  SimpleFormatter *compiled_local;
  
  this = &compiled->compiledPattern;
  compiledPattern_00 = UnicodeString::getBuffer(this);
  iVar2 = UnicodeString::length(this);
  iVar2 = SimpleFormatter::getArgumentLimit(compiledPattern_00,iVar2);
  if (iVar2 == 2) {
    infixLength = 0;
    cVar1 = UnicodeString::charAt(this,1);
    uVar3 = (uint)(ushort)cVar1;
    prefixLength = 2;
    if (0xff < uVar3) {
      infixLength = uVar3 - 0x100;
      NumberStringBuilder::insert(result,index,this,2,uVar3 - 0xfe,field,status);
      prefixLength = uVar3 - 0xfd;
    }
    iVar2 = infixLength;
    cVar1 = UnicodeString::charAt(this,prefixLength);
    prefixLength = prefixLength + 1;
    if (0xff < (ushort)cVar1) {
      iVar4 = (ushort)cVar1 - 0x100;
      NumberStringBuilder::insert
                (result,index + infixLength,this,prefixLength,prefixLength + iVar4,field,status);
      infixLength = iVar4 + infixLength;
      prefixLength = iVar4 + prefixLength + 1;
    }
    iVar5 = UnicodeString::length(this);
    if (prefixLength == iVar5) {
      local_60 = 0;
    }
    else {
      cVar1 = UnicodeString::charAt(this,prefixLength);
      local_60 = (ushort)cVar1 - 0x100;
      NumberStringBuilder::insert
                (result,index + infixLength,this,prefixLength + 1,prefixLength + 1 + local_60,field,
                 status);
      infixLength = local_60 + infixLength;
    }
    *outPrefixLength = iVar2;
    *outSuffixLength = local_60;
    compiled_local._4_4_ = infixLength;
  }
  else {
    *status = U_INTERNAL_PROGRAM_ERROR;
    compiled_local._4_4_ = 0;
  }
  return compiled_local._4_4_;
}

Assistant:

int32_t
SimpleModifier::formatTwoArgPattern(const SimpleFormatter& compiled, NumberStringBuilder& result,
                                    int32_t index, int32_t* outPrefixLength, int32_t* outSuffixLength,
                                    Field field, UErrorCode& status) {
    const UnicodeString& compiledPattern = compiled.compiledPattern;
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            compiledPattern.getBuffer(), compiledPattern.length());
    if (argLimit != 2) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return 0;
    }
    int32_t offset = 1; // offset into compiledPattern
    int32_t length = 0; // chars added to result

    int32_t prefixLength = compiledPattern.charAt(offset);
    offset++;
    if (prefixLength < ARG_NUM_LIMIT) {
        // No prefix
        prefixLength = 0;
    } else {
        prefixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + prefixLength, field, status);
        offset += prefixLength;
        length += prefixLength;
        offset++;
    }

    int32_t infixLength = compiledPattern.charAt(offset);
    offset++;
    if (infixLength < ARG_NUM_LIMIT) {
        // No infix
        infixLength = 0;
    } else {
        infixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + infixLength, field, status);
        offset += infixLength;
        length += infixLength;
        offset++;
    }

    int32_t suffixLength;
    if (offset == compiledPattern.length()) {
        // No suffix
        suffixLength = 0;
    } else {
        suffixLength = compiledPattern.charAt(offset) -  ARG_NUM_LIMIT;
        offset++;
        result.insert(index + length, compiledPattern, offset, offset + suffixLength, field, status);
        length += suffixLength;
    }

    *outPrefixLength = prefixLength;
    *outSuffixLength = suffixLength;

    return length;
}